

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O2

void indent(buffer *b,size_t amount)

{
  long lVar1;
  long lVar2;
  size_t i;
  long lVar3;
  undefined8 uStack_10;
  
  lVar1 = -(amount * 4 + 0x10 & 0xfffffffffffffff0);
  lVar2 = lVar1 + -8;
  for (lVar3 = 0; amount * 4 != lVar3; lVar3 = lVar3 + 1) {
    (&stack0xfffffffffffffff8)[lVar3 + lVar2 + 8] = 0x20;
  }
  (&stack0xfffffffffffffff8)[amount * 4 + lVar2 + 8] = 0;
  *(undefined8 *)((long)&uStack_10 + lVar1) = 0x103a5b;
  bprintf(b,"%s");
  return;
}

Assistant:

static void indent(struct buffer* b, size_t amount)
{
    size_t spaces = amount * 4; /* 4 spaces per indent */

    char temp[spaces + 1];

    for(size_t i = 0; i < spaces; ++i)
        temp[i] = ' ';
    temp[spaces] = '\0';

    bprintf(b, "%s", temp);
}